

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

void downsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int16_t iVar4;
  int iVar5;
  int32_t iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  ulong uVar12;
  int32_t iVar13;
  int32_t iVar14;
  int iVar15;
  int32_t iVar16;
  int iVar17;
  int32_t iVar18;
  
  iVar11 = filtState[3];
  iVar3 = filtState[7];
  iVar6 = *filtState;
  iVar13 = filtState[1];
  iVar16 = filtState[2];
  iVar18 = filtState[4];
  iVar14 = filtState[5];
  iVar10 = filtState[6];
  for (uVar12 = 0; len >> 1 != uVar12; uVar12 = uVar12 + 1) {
    sVar1 = in[uVar12 * 2];
    uVar7 = sVar1 * 0x400 - iVar13;
    iVar15 = ((uVar7 & 0xffff) * 0x2fa7 >> 0x10) + ((int)uVar7 >> 0x10) * 0x2fa7 + iVar6;
    uVar7 = iVar15 - iVar16;
    iVar17 = ((uVar7 & 0xffff) * 0x925f >> 0x10) + ((int)uVar7 >> 0x10) * 0x925f + iVar13;
    uVar7 = iVar17 - iVar11;
    iVar11 = ((uVar7 & 0xffff) * 0xeb5f >> 0x10) + ((int)uVar7 >> 0x10) * 0xeb5f + iVar16;
    sVar2 = in[uVar12 * 2 + 1];
    uVar7 = sVar2 * 0x400 - iVar14;
    iVar9 = ((uVar7 & 0xffff) * 0xcd4 >> 0x10) + ((int)uVar7 >> 0x10) * 0xcd4 + iVar18;
    uVar7 = iVar9 - iVar10;
    iVar8 = ((uVar7 & 0xffff) * 0x5f79 >> 0x10) + ((int)uVar7 >> 0x10) * 0x5f79 + iVar14;
    uVar7 = iVar8 - iVar3;
    iVar3 = ((uVar7 & 0xffff) * 0xc178 >> 0x10) + ((int)uVar7 >> 0x10) * 0xc178 + iVar10;
    iVar5 = iVar11 + iVar3 + 0x400 >> 0xb;
    iVar4 = (int16_t)iVar5;
    if (iVar5 < -0x7fff) {
      iVar4 = -0x8000;
    }
    out[uVar12] = iVar4;
    iVar6 = sVar1 * 0x400;
    iVar13 = iVar15;
    iVar16 = iVar17;
    iVar18 = sVar2 * 0x400;
    iVar14 = iVar9;
    iVar10 = iVar8;
  }
  *filtState = iVar6;
  filtState[1] = iVar13;
  filtState[2] = iVar16;
  filtState[3] = iVar11;
  filtState[4] = iVar18;
  filtState[5] = iVar14;
  filtState[6] = iVar10;
  filtState[7] = iVar3;
  return;
}

Assistant:

static __inline void downsampleBy2(const int16_t *in, size_t len, int16_t *out, int32_t *filtState) {
    int32_t tmp1, tmp2, diff, in32, out32;
    size_t i;

    register int32_t state0 = filtState[0];
    register int32_t state1 = filtState[1];
    register int32_t state2 = filtState[2];
    register int32_t state3 = filtState[3];
    register int32_t state4 = filtState[4];
    register int32_t state5 = filtState[5];
    register int32_t state6 = filtState[6];
    register int32_t state7 = filtState[7];

    for (i = (len >> 1); i > 0; i--) {
        // lower allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state1;
        tmp1 = ((state0) + ((diff) >> 16) * (kResampleAllpass2[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[0])) >> 16));
        state0 = in32;
        diff = tmp1 - state2;
        tmp2 = ((state1) + ((diff) >> 16) * (kResampleAllpass2[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[1])) >> 16));
        state1 = tmp1;
        diff = tmp2 - state3;
        state3 = ((state2) + ((diff) >> 16) * (kResampleAllpass2[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[2])) >> 16));
        state2 = tmp2;

        // upper allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state5;
        tmp1 = ((state4) + ((diff) >> 16) * (kResampleAllpass1[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[0])) >> 16));

        state4 = in32;
        diff = tmp1 - state6;
        tmp2 = ((state5) + ((diff) >> 16) * (kResampleAllpass1[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[1])) >> 16));

        state5 = tmp1;
        diff = tmp2 - state7;
        state7 = ((state6) + ((diff) >> 16) * (kResampleAllpass1[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[2])) >> 16));

        state6 = tmp2;

        // add two allpass outputs, divide by two and round
        out32 = (state3 + state7 + 1024) >> 11;

        // limit amplitude to prevent wrap-around, and write to output array
        *out++ = SatW32ToW16(out32);
    }

    filtState[0] = state0;
    filtState[1] = state1;
    filtState[2] = state2;
    filtState[3] = state3;
    filtState[4] = state4;
    filtState[5] = state5;
    filtState[6] = state6;
    filtState[7] = state7;
}